

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

void __thiscall Cmd::editMoveNextWord(Cmd *this,State *state)

{
  ulong uVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  string_view str;
  string sStack_98;
  basic_string_view<char,_std::char_traits<char>_> bStack_78;
  char acStack_68 [64];
  
  uVar1 = (state->buf)._M_string_length;
  uVar3 = state->pos;
  while ((uVar3 < uVar1 && ((state->buf)._M_dataplus._M_p[uVar3] == ' '))) {
    uVar3 = uVar3 + 1;
    state->pos = uVar3;
  }
  while ((uVar3 < uVar1 && ((state->buf)._M_dataplus._M_p[uVar3] != ' '))) {
    uVar3 = uVar3 + 1;
    state->pos = uVar3;
  }
  if (this->multiline_mode == true) {
    refreshMultiLine(this,state);
    return;
  }
  sVar2 = (this->prompt)._M_string_length;
  sStack_98._M_dataplus._M_p = (pointer)&sStack_98.field_2;
  sStack_98._M_string_length = 0;
  sStack_98.field_2._M_local_buf[0] = '\0';
  uVar3 = state->cols;
  uVar1 = state->pos + sVar2;
  uVar5 = uVar3 - 1;
  if (uVar1 < uVar3 - 1) {
    uVar5 = uVar1;
  }
  uVar4 = ((state->buf)._M_string_length + uVar5) - state->pos;
  bStack_78._M_str = (state->buf)._M_dataplus._M_p + (uVar1 - uVar5);
  if (uVar3 < uVar4) {
    uVar4 = uVar3;
  }
  bStack_78._M_len = uVar4 - sVar2;
  std::__cxx11::string::append((char *)&sStack_98);
  std::__cxx11::string::append((string *)&sStack_98);
  if (state->mask_mode == true) {
    std::__cxx11::string::append((ulong)&sStack_98,(char)(uVar4 - sVar2));
  }
  else {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&sStack_98,&bStack_78);
  }
  refreshShowHints(this,&sStack_98,state,(int)sVar2);
  std::__cxx11::string::append((char *)&sStack_98);
  snprintf(acStack_68,0x40,"\r\x1b[%dC",uVar5 & 0xffffffff);
  std::__cxx11::string::append((char *)&sStack_98);
  str._M_str = sStack_98._M_dataplus._M_p;
  str._M_len = sStack_98._M_string_length;
  write_string(this,str);
  std::__cxx11::string::~string((string *)&sStack_98);
  return;
}

Assistant:

void editMoveNextWord(State *state) {
		while (state->pos < state->buf.size() && state->buf[state->pos] == ' ')
			state->pos++;

		while (state->pos < state->buf.size() && state->buf[state->pos] != ' ')
			state->pos++;

		refreshLine(state);
	}